

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_square_matrix.h
# Opt level: O0

uchar __thiscall
sparse_square_matrix<unsigned_char>::get
          (sparse_square_matrix<unsigned_char> *this,uint32_t i,uint32_t j)

{
  bool bVar1;
  const_reference pvVar2;
  pointer pvVar3;
  uchar local_41;
  _Node_iterator_base<std::pair<const_unsigned_long,_unsigned_char>,_false> local_38;
  ulong local_30;
  _Node_iterator_base<std::pair<const_unsigned_long,_unsigned_char>,_false> local_28;
  const_iterator iter;
  uint32_t j_local;
  uint32_t i_local;
  sparse_square_matrix<unsigned_char> *this_local;
  
  iter.super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_char>,_false>._M_cur._0_4_
       = j;
  iter.super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_char>,_false>._M_cur._4_4_
       = i;
  if (this->N <= i) {
    __assert_fail("i < N",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/support/sparse_square_matrix.h"
                  ,0x39,
                  "const Ty sparse_square_matrix<unsigned char>::get(uint32_t, uint32_t) const [Ty = unsigned char]"
                 );
  }
  if (j < this->N) {
    bVar1 = usingDenseStorage(this);
    if (bVar1) {
      pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&this->denseStorage,
                          (ulong)(iter.
                                  super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_char>,_false>
                                  ._M_cur._4_4_ * this->N +
                                 (uint32_t)
                                 iter.
                                 super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_char>,_false>
                                 ._M_cur));
      this_local._7_1_ = *pvVar2;
    }
    else {
      local_30 = (ulong)(iter.
                         super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_char>,_false>
                         ._M_cur._4_4_ * this->N +
                        (uint32_t)
                        iter.
                        super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_char>,_false>
                        ._M_cur);
      local_28._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_long,_unsigned_char,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::find(&this->sparseStorage,&local_30);
      local_38._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_long,_unsigned_char,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
           ::end(&this->sparseStorage);
      bVar1 = std::__detail::operator==(&local_28,&local_38);
      if (bVar1) {
        local_41 = '\0';
      }
      else {
        pvVar3 = std::__detail::
                 _Node_const_iterator<std::pair<const_unsigned_long,_unsigned_char>,_false,_false>::
                 operator->((_Node_const_iterator<std::pair<const_unsigned_long,_unsigned_char>,_false,_false>
                             *)&local_28);
        local_41 = pvVar3->second;
      }
      this_local._7_1_ = local_41;
    }
    return this_local._7_1_;
  }
  __assert_fail("j < N",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/support/sparse_square_matrix.h"
                ,0x3a,
                "const Ty sparse_square_matrix<unsigned char>::get(uint32_t, uint32_t) const [Ty = unsigned char]"
               );
}

Assistant:

const Ty get(uint32_t i, uint32_t j) const {
    assert(i < N);
    assert(j < N);
    if (usingDenseStorage()) {
      return denseStorage[i * N + j];
    }
    auto iter = sparseStorage.find(i * N + j);
    return iter == sparseStorage.end() ? Ty() : iter->second;
  }